

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O2

void Abc_ManShowCutCone_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vDivs)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  void **ppvVar4;
  int in_EDX;
  int Fill;
  uint uVar5;
  int iVar6;
  
  pAVar2 = pNode->pNtk;
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,in_EDX);
  if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar6] != iVar1) {
    iVar6 = pNode->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill);
    if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar3->vTravIds).pArray[iVar6] = iVar1;
    Abc_ManShowCutCone_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vDivs);
    Abc_ManShowCutCone_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vDivs);
    iVar6 = vDivs->nSize;
    if (iVar6 == vDivs->nCap) {
      uVar5 = 0x10;
      if (0xf < iVar6) {
        uVar5 = iVar6 * 2;
      }
      if (iVar6 < (int)uVar5) {
        if (vDivs->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar5 << 3);
        }
        else {
          ppvVar4 = (void **)realloc(vDivs->pArray,(ulong)uVar5 << 3);
          iVar6 = vDivs->nSize;
        }
        vDivs->pArray = ppvVar4;
        vDivs->nCap = uVar5;
      }
    }
    vDivs->nSize = iVar6 + 1;
    vDivs->pArray[iVar6] = pNode;
  }
  return;
}

Assistant:

void Abc_ManShowCutCone_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vDivs )
{
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    Abc_ManShowCutCone_rec( Abc_ObjFanin0(pNode), vDivs );
    Abc_ManShowCutCone_rec( Abc_ObjFanin1(pNode), vDivs );
    Vec_PtrPush( vDivs, pNode );
}